

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Detonation_PDU::Encode(Detonation_PDU *this,KDataStream *stream)

{
  Descriptor *pDVar1;
  pointer pKVar2;
  pointer pKVar3;
  MunitionDescriptor md;
  MunitionDescriptor local_38;
  
  Warfare_Header::Encode(&this->super_Warfare_Header,stream);
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Velocity,stream);
  (*(this->m_LocationWorldCoords).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_LocationWorldCoords,stream);
  pDVar1 = (this->m_pDescriptor).m_pRef;
  if (pDVar1 == (Descriptor *)0x0) {
    DATA_TYPE::MunitionDescriptor::MunitionDescriptor(&local_38);
    (*local_38.super_Descriptor.super_DataTypeBase._vptr_DataTypeBase[5])(&local_38,stream);
    DATA_TYPE::Descriptor::~Descriptor(&local_38.super_Descriptor);
  }
  else {
    (*(pDVar1->super_DataTypeBase)._vptr_DataTypeBase[5])(pDVar1,stream);
  }
  (*(this->m_LocationEntityCoords).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_LocationEntityCoords,stream);
  KDataStream::Write(stream,this->m_ui8DetonationResult);
  KDataStream::Write(stream,this->m_ui8NumOfVariableParams);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  pKVar2 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->m_vVariableParameters).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar2; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar3->m_pRef,stream);
  }
  return;
}

Assistant:

void Detonation_PDU::Encode( KDataStream & stream ) const
{
    Warfare_Header::Encode( stream );

    stream << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_LocationWorldCoords;

    if( !m_pDescriptor.GetPtr() )
    {
        // Create a temp to fill the buffer.
        MunitionDescriptor md;
        stream << KDIS_STREAM md;
    }
    else
    {
        m_pDescriptor->Encode( stream );
    }

    stream << KDIS_STREAM m_LocationEntityCoords
           << m_ui8DetonationResult
           << m_ui8NumOfVariableParams
           << m_ui16Padding1;

    // Add the variable params
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ( *citr )->Encode( stream );
    }
}